

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveInstantiation.cpp
# Opt level: O2

ClauseIterator __thiscall
Inferences::PrimitiveInstantiation::generateClauses(PrimitiveInstantiation *this,Clause *premise)

{
  ResultFn f;
  FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>
  *in_RDX;
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>,_Inferences::PrimitiveInstantiation::ResultFn,_Kernel::Clause_*>
  it4;
  FlatMapIter<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65)>_>,_Inferences::PrimitiveInstantiation::IsInstantiable>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn>
  it3;
  FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>
  local_150;
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>,_Inferences::PrimitiveInstantiation::ResultFn,_Kernel::Clause_*>
  local_110;
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>,_Inferences::PrimitiveInstantiation::ResultFn,_Kernel::Clause_*>
  local_c8;
  FlatMapIter<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65)>_>,_Inferences::PrimitiveInstantiation::IsInstantiable>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn>
  local_80;
  Lib local_40 [16];
  undefined8 local_30;
  uint local_28;
  undefined8 local_20;
  
  f._cl._0_4_ = *(uint *)((long)&(in_RDX->_current).
                                 super_OptionBase<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>
                                 ._elem._elem + 4) & 0xfffff;
  f._cl._4_4_ = 0;
  local_30 = 0;
  local_20 = 0;
  local_28 = (uint)f._cl;
  Lib::
  getMapAndFlattenIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::PrimitiveInstantiation::IsInstantiable,false>,Inferences::PrimitiveInstantiation::ApplicableRewritesFn>
            (&local_80,local_40,
             *(FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>
               **)&(premise->super_Unit)._inference.field_0x8,(ApplicableRewritesFn)f._cl);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>
  ::FlatteningIterator(&local_150,&local_80);
  Lib::
  getMappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::PrimitiveInstantiation::IsInstantiable,false>,Inferences::PrimitiveInstantiation::ApplicableRewritesFn,Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermWithoutValue>>>>,Inferences::PrimitiveInstantiation::ResultFn>
            (&local_c8,(Lib *)&local_150,in_RDX,f);
  Lib::
  OptionBase<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>
  ::~OptionBase(&local_150._current.
                 super_OptionBase<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>
               );
  Lib::
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>,_Inferences::PrimitiveInstantiation::ResultFn,_Kernel::Clause_*>
  ::MappingIterator(&local_110,&local_c8);
  Lib::
  pvi<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::PrimitiveInstantiation::IsInstantiable,false>,Inferences::PrimitiveInstantiation::ApplicableRewritesFn,Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermWithoutValue>>>>,Inferences::PrimitiveInstantiation::ResultFn,Kernel::Clause*>>
            ((Lib *)this,&local_110);
  Lib::
  OptionBase<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>
  ::~OptionBase(&local_110._inner._current.
                 super_OptionBase<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>
               );
  Lib::
  OptionBase<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>
  ::~OptionBase(&local_c8._inner._current.
                 super_OptionBase<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>
               );
  Lib::
  OptionBase<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>
  ::~OptionBase(&local_80._current.
                 super_OptionBase<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>
               );
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
}

Assistant:

ClauseIterator PrimitiveInstantiation::generateClauses(Clause* premise)
{
  //is this correct?
  auto it1 = premise->getSelectedLiteralIterator();
  //filter out literals that are not suitable for narrowing
  auto it2 = getFilteredIterator(it1, IsInstantiable());

  //pair of literals and possible rewrites that can be applied to literals
  auto it3 = getMapAndFlattenIterator(it2, ApplicableRewritesFn(_index));
  
  //apply rewrite rules to literals
  auto it4 = getMappingIterator(it3, ResultFn(premise));
  

  return pvi( it4 );

}